

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

int it_xm_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,int n_channels,uchar *buffer,int version)

{
  uchar uVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long in_RCX;
  int in_EDX;
  DUMBFILE *in_RSI;
  int *in_RDI;
  int in_R8D;
  int note;
  uchar mask;
  IT_ENTRY *entry;
  int effectvalue;
  int effect;
  int row;
  int channel;
  int pos;
  int size;
  DUMBFILE *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar6;
  undefined8 in_stack_ffffffffffffffb0;
  int32 n;
  IT_ENTRY *entry_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint value;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_4;
  
  n = (int32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffff98);
  iVar3 = 9;
  if (in_R8D == 0x102) {
    iVar3 = 8;
  }
  if (iVar2 == iVar3) {
    iVar3 = dumbfile_getc(in_stack_ffffffffffffff98);
    if (iVar3 == 0) {
      if (in_R8D == 0x102) {
        iVar3 = dumbfile_getc(in_stack_ffffffffffffff98);
        *in_RDI = iVar3 + 1;
      }
      else {
        iVar3 = dumbfile_igetw(in_stack_ffffffffffffff98);
        *in_RDI = iVar3;
      }
      iVar3 = dumbfile_igetw(in_stack_ffffffffffffff98);
      in_RDI[1] = 0;
      iVar4 = dumbfile_error(in_RSI);
      if (iVar4 == 0) {
        if (iVar3 == 0) {
          local_4 = 0;
        }
        else if (iVar3 == in_EDX * 0x500 ||
                 SBORROW4(iVar3,in_EDX * 0x500) != iVar3 + in_EDX * -0x500 < 0) {
          iVar2 = dumbfile_getnc((char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8),n,
                                 (DUMBFILE *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          if (iVar2 < iVar3) {
            local_4 = -1;
          }
          else {
            in_RDI[1] = 0;
            local_3c = 0;
            local_38 = 0;
            local_34 = 0;
            while (local_34 < iVar3) {
              if (((*(byte *)(in_RCX + local_34) & 0x80) == 0) ||
                 ((*(byte *)(in_RCX + local_34) & 0x1f) != 0)) {
                in_RDI[1] = in_RDI[1] + 1;
              }
              local_38 = local_38 + 1;
              if (in_EDX <= local_38) {
                local_38 = 0;
                local_3c = local_3c + 1;
                in_RDI[1] = in_RDI[1] + 1;
              }
              if ((*(byte *)(in_RCX + local_34) & 0x80) == 0) {
                local_34 = local_34 + 5;
              }
              else {
                local_34 = ""[(int)(*(byte *)(in_RCX + local_34) & 0x1f)] + 1 + local_34;
              }
            }
            if (*in_RDI < local_3c) {
              local_4 = -1;
            }
            else {
              for (; local_3c < *in_RDI; local_3c = local_3c + 1) {
                in_RDI[1] = in_RDI[1] + 1;
              }
              pvVar5 = malloc((long)in_RDI[1] * 7);
              *(void **)(in_RDI + 2) = pvVar5;
              if (*(long *)(in_RDI + 2) == 0) {
                local_4 = -1;
              }
              else {
                entry_00 = *(IT_ENTRY **)(in_RDI + 2);
                local_3c = 0;
                local_38 = 0;
                local_34 = 0;
                while (local_34 < iVar3) {
                  if ((*(byte *)(in_RCX + local_34) & 0x80) == 0) {
                    uVar6 = 0x1f000000;
                  }
                  else {
                    uVar6 = (*(byte *)(in_RCX + local_34) & 0x1f) << 0x18;
                    local_34 = local_34 + 1;
                  }
                  if ((char)(uVar6 >> 0x18) != '\0') {
                    entry_00->channel = (uchar)local_38;
                    entry_00->mask = '\0';
                    if ((uVar6 & 0x1000000) != 0) {
                      if (*(char *)(in_RCX + local_34) == 'a') {
                        uVar1 = 0xff;
                      }
                      else {
                        uVar1 = *(char *)(in_RCX + local_34) + 0xff;
                      }
                      entry_00->note = uVar1;
                      entry_00->mask = entry_00->mask | 1;
                      local_34 = local_34 + 1;
                    }
                    if ((uVar6 & 0x2000000) != 0) {
                      entry_00->instrument = *(uchar *)(in_RCX + local_34);
                      entry_00->mask = entry_00->mask | 2;
                      local_34 = local_34 + 1;
                    }
                    if ((uVar6 & 0x4000000) != 0) {
                      it_xm_convert_volume((uint)*(byte *)(in_RCX + local_34),entry_00);
                      local_34 = local_34 + 1;
                    }
                    value = 0;
                    local_40 = 0;
                    if ((uVar6 & 0x8000000) != 0) {
                      local_40 = (uint)*(byte *)(in_RCX + local_34);
                      local_34 = local_34 + 1;
                    }
                    if ((uVar6 & 0x10000000) != 0) {
                      value = (uint)*(byte *)(in_RCX + local_34);
                      local_34 = local_34 + 1;
                    }
                    _dumb_it_xm_convert_effect(local_40,value,entry_00,0);
                    entry_00 = entry_00 + 1;
                  }
                  local_38 = local_38 + 1;
                  if (in_EDX <= local_38) {
                    local_38 = 0;
                    local_3c = local_3c + 1;
                    entry_00->channel = 0xff;
                    entry_00 = entry_00 + 1;
                  }
                }
                while (local_3c < *in_RDI) {
                  local_3c = local_3c + 1;
                  entry_00->channel = 0xff;
                  entry_00 = entry_00 + 1;
                }
                local_4 = 0;
              }
            }
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int it_xm_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, int n_channels, unsigned char *buffer, int version)
{
	int size;
	int pos;
	int channel;
	int row;
	int effect, effectvalue;
	IT_ENTRY *entry;

	/* pattern header size */
	if (dumbfile_igetl(f) != ( version == 0x0102 ? 0x08 : 0x09 ) ) {
		TRACE("XM error: unexpected pattern header size\n");
		return -1;
	}

	/* pattern data packing type */
	if (dumbfile_getc(f) != 0) {
		TRACE("XM error: unexpected pattern packing type\n");
		return -1;
	}

	if ( version == 0x0102 )
		pattern->n_rows = dumbfile_getc(f) + 1;
	else
		pattern->n_rows = dumbfile_igetw(f);  /* 1..256 */
	size = dumbfile_igetw(f);
	pattern->n_entries = 0;

	if (dumbfile_error(f))
		return -1;

	if (size == 0)
		return 0;

	if (size > 1280 * n_channels) {
		TRACE("XM error: pattern data size > %d bytes\n", 1280 * n_channels);
		return -1;
	}

    if (dumbfile_getnc((char *)buffer, size, f) < size)
		return -1;

	/* compute number of entries */
	pattern->n_entries = 0;
	pos = channel = row = 0;
	while (pos < size) {
		if (!(buffer[pos] & XM_ENTRY_PACKED) || (buffer[pos] & 31))
			pattern->n_entries++;

		channel++;
		if (channel >= n_channels) {
			channel = 0;
			row++;
			pattern->n_entries++;
		}

		if (buffer[pos] & XM_ENTRY_PACKED) {
			static const char offset[] = { 0, 1, 1, 2, 1, 2, 2, 3,   1, 2, 2, 3, 2, 3, 3, 4,
			                               1, 2, 2, 3, 2, 3, 3, 4,   2, 3, 3, 4, 3, 4, 4, 5 };
			pos += 1 + offset[buffer[pos] & 31];
		} else {
			pos += 5;
		}
	}

	if (row > pattern->n_rows) {
		TRACE("XM error: wrong number of rows in pattern data\n");
		return -1;
	}

	/* Whoops, looks like some modules may be short, a few channels, maybe even rows... */

	while (row < pattern->n_rows)
	{
		pattern->n_entries++;
		row++;
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	/* read the entries */
	entry = pattern->entry;
	pos = channel = row = 0;
	while (pos < size) {
		unsigned char mask;

		if (buffer[pos] & XM_ENTRY_PACKED)
			mask = buffer[pos++] & 31;
		else
			mask = 31;

		if (mask) {
			ASSERT(entry < pattern->entry + pattern->n_entries);

			entry->channel = channel;
			entry->mask = 0;

			if (mask & XM_ENTRY_NOTE) {
				int note = buffer[pos++]; /* 1-96 <=> C0-B7 */
				entry->note = (note == XM_NOTE_OFF) ? (IT_NOTE_OFF) : (note-1);
				entry->mask |= IT_ENTRY_NOTE;
			}

			if (mask & XM_ENTRY_INSTRUMENT) {
				entry->instrument = buffer[pos++]; /* 1-128 */
				entry->mask |= IT_ENTRY_INSTRUMENT;
			}

			if (mask & XM_ENTRY_VOLUME)
				it_xm_convert_volume(buffer[pos++], entry);

			effect = effectvalue = 0;
			if (mask & XM_ENTRY_EFFECT)      effect = buffer[pos++];
			if (mask & XM_ENTRY_EFFECTVALUE) effectvalue = buffer[pos++];
			_dumb_it_xm_convert_effect(effect, effectvalue, entry, 0);

			entry++;
		}

		channel++;
		if (channel >= n_channels) {
			channel = 0;
			row++;
			IT_SET_END_ROW(entry);
			entry++;
		}
	}

	while (row < pattern->n_rows)
	{
		row++;
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}